

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined4 uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  RTCRayN *pRVar25;
  long lVar26;
  ulong uVar27;
  ulong unaff_RBP;
  size_t mask;
  NodeRef *pNVar28;
  Scene *pSVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  size_t sVar36;
  ulong uVar37;
  uint *puVar38;
  bool bVar39;
  bool bVar40;
  float fVar41;
  uint uVar42;
  float fVar43;
  float fVar48;
  float fVar51;
  vint4 bi;
  uint uVar49;
  float fVar50;
  uint uVar52;
  float fVar53;
  float fVar54;
  uint uVar55;
  float fVar56;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar57;
  uint uVar58;
  uint uVar59;
  float fVar60;
  float fVar61;
  float fVar67;
  float fVar72;
  vint4 ai;
  uint uVar68;
  uint uVar69;
  float fVar70;
  float fVar71;
  uint uVar73;
  uint uVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  uint uVar79;
  uint uVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint uVar83;
  uint uVar84;
  uint uVar85;
  vint4 ai_1;
  uint uVar86;
  float fVar87;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar88 [16];
  float fVar92;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  int iVar121;
  float fVar122;
  float fVar123;
  int iVar124;
  float fVar125;
  float fVar126;
  int iVar127;
  int iVar128;
  float fVar129;
  int iVar133;
  float fVar134;
  int iVar135;
  float fVar136;
  int iVar137;
  float fVar138;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 local_b48 [16];
  ulong local_b38;
  undefined4 local_b2c;
  int local_b28;
  int iStack_b24;
  int iStack_b20;
  int iStack_b1c;
  int local_b18;
  int iStack_b14;
  int iStack_b10;
  int iStack_b0c;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float local_ae8;
  float fStack_ae4;
  float fStack_ae0;
  float fStack_adc;
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float local_ac8;
  float fStack_ac4;
  float fStack_ac0;
  float fStack_abc;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  undefined8 local_a98;
  float fStack_a90;
  float fStack_a8c;
  undefined8 local_a88;
  float fStack_a80;
  float fStack_a7c;
  undefined8 local_a78;
  ulong local_a70;
  ulong local_a68;
  ulong local_a60;
  ulong local_a58;
  ulong local_a50;
  ulong local_a48;
  NodeRef *local_a40;
  long local_a38;
  Scene *local_a30;
  RTCFilterFunctionNArguments args;
  float fStack_9f0;
  float fStack_9ec;
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  float local_908 [4];
  undefined1 local_8f8 [8];
  float fStack_8f0;
  float fStack_8ec;
  undefined1 local_8e8 [8];
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8 [4];
  undefined1 local_8c8 [16];
  undefined4 local_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  undefined4 local_888;
  undefined4 uStack_884;
  undefined4 uStack_880;
  undefined4 uStack_87c;
  undefined1 local_878 [16];
  undefined4 local_868;
  undefined4 uStack_864;
  undefined4 uStack_860;
  undefined4 uStack_85c;
  uint local_858;
  uint uStack_854;
  uint uStack_850;
  uint uStack_84c;
  uint local_848;
  uint uStack_844;
  uint uStack_840;
  uint uStack_83c;
  uint local_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  undefined1 local_7f8 [16];
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar99 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar61 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar71 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar76 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar129 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar87 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar33 = uVar30 ^ 0x10;
  uVar34 = uVar31 ^ 0x10;
  uVar37 = uVar32 ^ 0x10;
  iVar21 = (tray->tnear).field_0.i[k];
  iVar128 = (tray->tfar).field_0.i[k];
  uVar22 = 0x224ff80;
  local_7e8 = mm_lookupmask_ps._0_8_;
  uStack_7e0 = mm_lookupmask_ps._8_8_;
  local_7f8 = mm_lookupmask_ps._240_16_;
  local_a40 = stack + 1;
  fVar43 = fVar71;
  fVar134 = fVar71;
  fVar89 = fVar71;
  fVar50 = fVar76;
  fVar136 = fVar76;
  fVar90 = fVar76;
  fVar53 = fVar129;
  fVar138 = fVar129;
  fVar91 = fVar129;
  iVar121 = iVar21;
  iVar124 = iVar21;
  iVar127 = iVar21;
  fVar56 = fVar99;
  fVar60 = fVar99;
  fVar70 = fVar99;
  fVar75 = fVar61;
  fVar81 = fVar61;
  fVar92 = fVar61;
  fVar96 = fVar87;
  fVar97 = fVar87;
  fVar101 = fVar87;
  iVar133 = iVar128;
  iVar135 = iVar128;
  iVar137 = iVar128;
  local_b28 = iVar128;
  iStack_b24 = iVar128;
  iStack_b20 = iVar128;
  iStack_b1c = iVar128;
  local_b18 = iVar21;
  iStack_b14 = iVar21;
  iStack_b10 = iVar21;
  iStack_b0c = iVar21;
  local_b08 = fVar87;
  fStack_b04 = fVar87;
  fStack_b00 = fVar87;
  fStack_afc = fVar87;
  local_af8 = fVar129;
  fStack_af4 = fVar129;
  fStack_af0 = fVar129;
  fStack_aec = fVar129;
  local_ae8 = fVar76;
  fStack_ae4 = fVar76;
  fStack_ae0 = fVar76;
  fStack_adc = fVar76;
  local_ad8 = fVar71;
  fStack_ad4 = fVar71;
  fStack_ad0 = fVar71;
  fStack_acc = fVar71;
  local_ac8 = fVar61;
  fStack_ac4 = fVar61;
  fStack_ac0 = fVar61;
  fStack_abc = fVar61;
  local_ab8 = fVar99;
  fStack_ab4 = fVar99;
  fStack_ab0 = fVar99;
  fStack_aac = fVar99;
  local_a70 = uVar37;
  local_a68 = uVar34;
  local_a60 = uVar33;
  local_a58 = uVar32;
  local_a50 = uVar31;
  local_a48 = uVar30;
LAB_00287ea7:
  pNVar28 = local_a40;
  if (pNVar28 != stack) {
    local_a40 = pNVar28 + -1;
    sVar36 = pNVar28[-1].ptr;
    do {
      if ((sVar36 & 8) == 0) {
        pfVar5 = (float *)(sVar36 + 0x20 + uVar30);
        fVar41 = (*pfVar5 - fVar99) * fVar76;
        fVar48 = (pfVar5[1] - fVar56) * fVar50;
        fVar51 = (pfVar5[2] - fVar60) * fVar136;
        fVar54 = (pfVar5[3] - fVar70) * fVar90;
        pfVar5 = (float *)(sVar36 + 0x20 + uVar31);
        fVar57 = (*pfVar5 - fVar61) * fVar129;
        fVar67 = (pfVar5[1] - fVar75) * fVar53;
        fVar72 = (pfVar5[2] - fVar81) * fVar138;
        fVar78 = (pfVar5[3] - fVar92) * fVar91;
        uVar58 = (uint)((int)fVar57 < (int)fVar41) * (int)fVar41 |
                 (uint)((int)fVar57 >= (int)fVar41) * (int)fVar57;
        uVar68 = (uint)((int)fVar67 < (int)fVar48) * (int)fVar48 |
                 (uint)((int)fVar67 >= (int)fVar48) * (int)fVar67;
        uVar73 = (uint)((int)fVar72 < (int)fVar51) * (int)fVar51 |
                 (uint)((int)fVar72 >= (int)fVar51) * (int)fVar72;
        uVar79 = (uint)((int)fVar78 < (int)fVar54) * (int)fVar54 |
                 (uint)((int)fVar78 >= (int)fVar54) * (int)fVar78;
        pfVar5 = (float *)(sVar36 + 0x20 + uVar32);
        fVar41 = (*pfVar5 - fVar71) * fVar87;
        fVar48 = (pfVar5[1] - fVar43) * fVar96;
        fVar51 = (pfVar5[2] - fVar134) * fVar97;
        fVar54 = (pfVar5[3] - fVar89) * fVar101;
        uVar42 = (uint)((int)fVar41 < iVar21) * iVar21 | (uint)((int)fVar41 >= iVar21) * (int)fVar41
        ;
        uVar49 = (uint)((int)fVar48 < iVar121) * iVar121 |
                 (uint)((int)fVar48 >= iVar121) * (int)fVar48;
        uVar52 = (uint)((int)fVar51 < iVar124) * iVar124 |
                 (uint)((int)fVar51 >= iVar124) * (int)fVar51;
        uVar55 = (uint)((int)fVar54 < iVar127) * iVar127 |
                 (uint)((int)fVar54 >= iVar127) * (int)fVar54;
        pfVar5 = (float *)(sVar36 + 0x20 + uVar33);
        fVar41 = (*pfVar5 - fVar99) * fVar76;
        fVar48 = (pfVar5[1] - fVar56) * fVar50;
        fVar51 = (pfVar5[2] - fVar60) * fVar136;
        fVar54 = (pfVar5[3] - fVar70) * fVar90;
        pfVar5 = (float *)(sVar36 + 0x20 + uVar34);
        fVar57 = (*pfVar5 - fVar61) * fVar129;
        fVar67 = (pfVar5[1] - fVar75) * fVar53;
        fVar72 = (pfVar5[2] - fVar81) * fVar138;
        fVar78 = (pfVar5[3] - fVar92) * fVar91;
        uVar83 = (uint)((int)fVar41 < (int)fVar57) * (int)fVar41 |
                 (uint)((int)fVar41 >= (int)fVar57) * (int)fVar57;
        uVar84 = (uint)((int)fVar48 < (int)fVar67) * (int)fVar48 |
                 (uint)((int)fVar48 >= (int)fVar67) * (int)fVar67;
        uVar85 = (uint)((int)fVar51 < (int)fVar72) * (int)fVar51 |
                 (uint)((int)fVar51 >= (int)fVar72) * (int)fVar72;
        uVar86 = (uint)((int)fVar54 < (int)fVar78) * (int)fVar54 |
                 (uint)((int)fVar54 >= (int)fVar78) * (int)fVar78;
        pfVar5 = (float *)(sVar36 + 0x20 + uVar37);
        fVar41 = (*pfVar5 - fVar71) * fVar87;
        fVar48 = (pfVar5[1] - fVar43) * fVar96;
        fVar51 = (pfVar5[2] - fVar134) * fVar97;
        fVar54 = (pfVar5[3] - fVar89) * fVar101;
        uVar59 = (uint)(iVar128 < (int)fVar41) * iVar128 |
                 (uint)(iVar128 >= (int)fVar41) * (int)fVar41;
        uVar69 = (uint)(iVar133 < (int)fVar48) * iVar133 |
                 (uint)(iVar133 >= (int)fVar48) * (int)fVar48;
        uVar74 = (uint)(iVar135 < (int)fVar51) * iVar135 |
                 (uint)(iVar135 >= (int)fVar51) * (int)fVar51;
        uVar80 = (uint)(iVar137 < (int)fVar54) * iVar137 |
                 (uint)(iVar137 >= (int)fVar54) * (int)fVar54;
        auVar111._0_4_ =
             -(uint)((int)(((int)uVar83 < (int)uVar59) * uVar83 |
                          ((int)uVar83 >= (int)uVar59) * uVar59) <
                    (int)(((int)uVar42 < (int)uVar58) * uVar58 |
                         ((int)uVar42 >= (int)uVar58) * uVar42));
        auVar111._4_4_ =
             -(uint)((int)(((int)uVar84 < (int)uVar69) * uVar84 |
                          ((int)uVar84 >= (int)uVar69) * uVar69) <
                    (int)(((int)uVar49 < (int)uVar68) * uVar68 |
                         ((int)uVar49 >= (int)uVar68) * uVar49));
        auVar111._8_4_ =
             -(uint)((int)(((int)uVar85 < (int)uVar74) * uVar85 |
                          ((int)uVar85 >= (int)uVar74) * uVar74) <
                    (int)(((int)uVar52 < (int)uVar73) * uVar73 |
                         ((int)uVar52 >= (int)uVar73) * uVar52));
        auVar111._12_4_ =
             -(uint)((int)(((int)uVar86 < (int)uVar80) * uVar86 |
                          ((int)uVar86 >= (int)uVar80) * uVar80) <
                    (int)(((int)uVar55 < (int)uVar79) * uVar79 |
                         ((int)uVar55 >= (int)uVar79) * uVar55));
        uVar20 = movmskps(uVar22,auVar111);
        unaff_RBP = (ulong)(byte)((byte)uVar20 ^ 0xf);
      }
      if ((sVar36 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar22 = 4;
        }
        else {
          uVar35 = sVar36 & 0xfffffffffffffff0;
          lVar26 = 0;
          if (unaff_RBP != 0) {
            for (; (unaff_RBP >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
            }
          }
          sVar36 = *(size_t *)(uVar35 + lVar26 * 8);
          uVar27 = unaff_RBP - 1 & unaff_RBP;
          if (uVar27 != 0) {
            local_a40->ptr = sVar36;
            lVar26 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
              }
            }
            uVar24 = uVar27 - 1;
            while( true ) {
              local_a40 = local_a40 + 1;
              sVar36 = *(size_t *)(uVar35 + lVar26 * 8);
              uVar24 = uVar24 & uVar27;
              if (uVar24 == 0) break;
              local_a40->ptr = sVar36;
              lVar26 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                }
              }
              uVar27 = uVar24 - 1;
            }
          }
          uVar22 = 0;
        }
      }
      else {
        uVar22 = 6;
      }
    } while (uVar22 == 0);
    if (uVar22 == 6) {
      uVar35 = (ulong)((uint)sVar36 & 0xf);
      uVar22 = 0;
      uVar27 = uVar35 - 8;
      bVar39 = uVar35 != 8;
      if (bVar39) {
        uVar30 = 0;
        do {
          pSVar29 = context->scene;
          puVar1 = (uint *)((sVar36 & 0xfffffffffffffff0) + uVar30 * 0x60);
          puVar38 = puVar1 + 0x10;
          ppfVar6 = (pSVar29->vertices).items;
          pfVar7 = ppfVar6[*puVar38];
          pfVar5 = pfVar7 + *puVar1;
          fVar129 = *pfVar5;
          fVar87 = pfVar5[1];
          fVar43 = pfVar5[2];
          pfVar5 = pfVar7 + puVar1[4];
          fVar41 = *pfVar5;
          fVar48 = pfVar5[1];
          local_a88._0_4_ = pfVar5[2];
          pfVar5 = pfVar7 + puVar1[0xc];
          fVar51 = *pfVar5;
          local_a98._0_4_ = pfVar5[1];
          fVar54 = pfVar5[2];
          pfVar8 = ppfVar6[puVar1[0x11]];
          pfVar5 = pfVar8 + puVar1[1];
          fVar134 = *pfVar5;
          fVar89 = pfVar5[1];
          fVar50 = pfVar5[2];
          pfVar5 = pfVar8 + puVar1[5];
          fVar57 = *pfVar5;
          fVar67 = pfVar5[1];
          local_a88._4_4_ = pfVar5[2];
          pfVar5 = pfVar8 + puVar1[0xd];
          fVar72 = *pfVar5;
          local_a98._4_4_ = pfVar5[1];
          fVar78 = pfVar5[2];
          pfVar9 = ppfVar6[puVar1[0x12]];
          pfVar5 = pfVar9 + puVar1[2];
          fVar136 = *pfVar5;
          fVar90 = pfVar5[1];
          fVar53 = pfVar5[2];
          pfVar5 = pfVar9 + puVar1[6];
          fVar77 = *pfVar5;
          fVar98 = pfVar5[1];
          pfVar2 = pfVar9 + puVar1[0xe];
          fStack_a90 = pfVar2[1];
          fVar114 = pfVar2[2];
          pfVar10 = ppfVar6[puVar1[0x13]];
          pfVar3 = pfVar10 + puVar1[3];
          fVar138 = *pfVar3;
          fVar91 = pfVar3[1];
          fVar56 = pfVar3[2];
          pfVar3 = pfVar10 + puVar1[7];
          fVar82 = *pfVar3;
          fVar100 = pfVar3[1];
          pfVar4 = pfVar10 + puVar1[0xf];
          fStack_a8c = pfVar4[1];
          fVar116 = pfVar4[2];
          fVar101 = fVar87 - fVar48;
          fVar102 = fVar89 - fVar67;
          fVar103 = fVar90 - fVar98;
          fVar104 = fVar91 - fVar100;
          local_a78 = (undefined1 (*) [16])CONCAT44(pfVar3[2],pfVar5[2]);
          fVar117 = fVar43 - (float)local_a88;
          fVar119 = fVar50 - local_a88._4_4_;
          fVar122 = fVar53 - pfVar5[2];
          fVar125 = fVar56 - pfVar3[2];
          fVar60 = fVar51 - fVar129;
          fVar70 = fVar72 - fVar134;
          fVar75 = *pfVar2 - fVar136;
          fVar81 = *pfVar4 - fVar138;
          fVar105 = (float)local_a98 - fVar87;
          fVar106 = local_a98._4_4_ - fVar89;
          fVar107 = fStack_a90 - fVar90;
          fVar108 = fStack_a8c - fVar91;
          fVar109 = fVar54 - fVar43;
          fVar112 = fVar78 - fVar50;
          fVar113 = fVar114 - fVar53;
          fVar115 = fVar116 - fVar56;
          local_8f8._0_4_ = fVar117 * fVar105 - fVar101 * fVar109;
          local_8f8._4_4_ = fVar119 * fVar106 - fVar102 * fVar112;
          fStack_8f0 = fVar122 * fVar107 - fVar103 * fVar113;
          fStack_8ec = fVar125 * fVar108 - fVar104 * fVar115;
          fVar99 = *(float *)(ray + k * 4);
          fVar92 = fVar129 - fVar99;
          fVar96 = fVar134 - fVar99;
          fVar97 = fVar136 - fVar99;
          fVar99 = fVar138 - fVar99;
          fVar61 = *(float *)(ray + k * 4 + 0x10);
          fVar87 = fVar87 - fVar61;
          fVar89 = fVar89 - fVar61;
          fVar90 = fVar90 - fVar61;
          fVar91 = fVar91 - fVar61;
          fVar61 = *(float *)(ray + k * 4 + 0x40);
          fVar71 = *(float *)(ray + k * 4 + 0x50);
          fVar143 = fVar92 * fVar71 - fVar87 * fVar61;
          fVar144 = fVar96 * fVar71 - fVar89 * fVar61;
          fVar145 = fVar97 * fVar71 - fVar90 * fVar61;
          fVar146 = fVar99 * fVar71 - fVar91 * fVar61;
          fVar129 = fVar129 - fVar41;
          fVar134 = fVar134 - fVar57;
          fVar136 = fVar136 - fVar77;
          fVar138 = fVar138 - fVar82;
          local_8e8._0_4_ = fVar129 * fVar109 - fVar117 * fVar60;
          local_8e8._4_4_ = fVar134 * fVar112 - fVar119 * fVar70;
          fStack_8e0 = fVar136 * fVar113 - fVar122 * fVar75;
          fStack_8dc = fVar138 * fVar115 - fVar125 * fVar81;
          fVar76 = *(float *)(ray + k * 4 + 0x20);
          fVar43 = fVar43 - fVar76;
          fVar50 = fVar50 - fVar76;
          fVar53 = fVar53 - fVar76;
          fVar56 = fVar56 - fVar76;
          fVar76 = *(float *)(ray + k * 4 + 0x60);
          fVar147 = fVar43 * fVar61 - fVar92 * fVar76;
          fVar148 = fVar50 * fVar61 - fVar96 * fVar76;
          fVar149 = fVar53 * fVar61 - fVar97 * fVar76;
          fVar150 = fVar56 * fVar61 - fVar99 * fVar76;
          local_8d8[0] = fVar101 * fVar60 - fVar129 * fVar105;
          local_8d8[1] = fVar102 * fVar70 - fVar134 * fVar106;
          local_8d8[2] = fVar103 * fVar75 - fVar136 * fVar107;
          local_8d8[3] = fVar104 * fVar81 - fVar138 * fVar108;
          fVar118 = fVar87 * fVar76 - fVar43 * fVar71;
          fVar120 = fVar89 * fVar76 - fVar50 * fVar71;
          fVar123 = fVar90 * fVar76 - fVar53 * fVar71;
          fVar126 = fVar91 * fVar76 - fVar56 * fVar71;
          fVar139 = fVar61 * (float)local_8f8._0_4_ +
                    fVar71 * (float)local_8e8._0_4_ + fVar76 * local_8d8[0];
          fVar140 = fVar61 * (float)local_8f8._4_4_ +
                    fVar71 * (float)local_8e8._4_4_ + fVar76 * local_8d8[1];
          fVar141 = fVar61 * fStack_8f0 + fVar71 * fStack_8e0 + fVar76 * local_8d8[2];
          fVar142 = fVar61 * fStack_8ec + fVar71 * fStack_8dc + fVar76 * local_8d8[3];
          uVar49 = (uint)fVar139 & 0x80000000;
          uVar52 = (uint)fVar140 & 0x80000000;
          uVar55 = (uint)fVar141 & 0x80000000;
          uVar58 = (uint)fVar142 & 0x80000000;
          fVar61 = (float)((uint)(fVar60 * fVar118 + fVar105 * fVar147 + fVar109 * fVar143) ^ uVar49
                          );
          fVar71 = (float)((uint)(fVar70 * fVar120 + fVar106 * fVar148 + fVar112 * fVar144) ^ uVar52
                          );
          fVar76 = (float)((uint)(fVar75 * fVar123 + fVar107 * fVar149 + fVar113 * fVar145) ^ uVar55
                          );
          fVar60 = (float)((uint)(fVar81 * fVar126 + fVar108 * fVar150 + fVar115 * fVar146) ^ uVar58
                          );
          fVar70 = (float)((uint)(fVar118 * fVar129 + fVar147 * fVar101 + fVar143 * fVar117) ^
                          uVar49);
          fVar75 = (float)((uint)(fVar120 * fVar134 + fVar148 * fVar102 + fVar144 * fVar119) ^
                          uVar52);
          fVar136 = (float)((uint)(fVar123 * fVar136 + fVar149 * fVar103 + fVar145 * fVar122) ^
                           uVar55);
          fVar138 = (float)((uint)(fVar126 * fVar138 + fVar150 * fVar104 + fVar146 * fVar125) ^
                           uVar58);
          fVar129 = ABS(fVar139);
          fVar134 = ABS(fVar140);
          auVar132._0_8_ = CONCAT44(fVar140,fVar139) & 0x7fffffff7fffffff;
          auVar132._8_4_ = ABS(fVar141);
          auVar132._12_4_ = ABS(fVar142);
          bVar17 = ((0.0 <= fVar70 && 0.0 <= fVar61) && fVar139 != 0.0) &&
                   fVar61 + fVar70 <= fVar129;
          auVar130._0_4_ = -(uint)bVar17;
          bVar19 = ((0.0 <= fVar75 && 0.0 <= fVar71) && fVar140 != 0.0) &&
                   fVar71 + fVar75 <= fVar134;
          auVar130._4_4_ = -(uint)bVar19;
          bVar18 = ((0.0 <= fVar136 && 0.0 <= fVar76) && fVar141 != 0.0) &&
                   fVar76 + fVar136 <= auVar132._8_4_;
          auVar130._8_4_ = -(uint)bVar18;
          bVar40 = ((0.0 <= fVar138 && 0.0 <= fVar60) && fVar142 != 0.0) &&
                   fVar60 + fVar138 <= auVar132._12_4_;
          auVar130._12_4_ = -(uint)bVar40;
          local_a38 = (sVar36 & 0xfffffffffffffff0) + uVar30 * 0x60;
          uVar22 = puVar1[8];
          uVar42 = movmskps((int)uVar34,auVar130);
          uVar34 = (ulong)uVar42;
          pfVar7 = pfVar7 + uVar22;
          local_aa8 = *pfVar7;
          fStack_aa4 = pfVar7[1];
          fStack_aa0 = pfVar7[2];
          fStack_a9c = pfVar7[3];
          pfVar8 = pfVar8 + puVar1[9];
          fVar102 = *pfVar8;
          fVar103 = pfVar8[1];
          fVar104 = pfVar8[2];
          fVar105 = pfVar8[3];
          pfVar9 = pfVar9 + puVar1[10];
          fVar106 = *pfVar9;
          fVar107 = pfVar9[1];
          fVar108 = pfVar9[2];
          fVar109 = pfVar9[3];
          pfVar10 = pfVar10 + puVar1[0xb];
          fVar112 = *pfVar10;
          fVar113 = pfVar10[1];
          fVar115 = pfVar10[2];
          fVar117 = pfVar10[3];
          local_a30 = pSVar29;
          if (uVar42 != 0) {
            fVar43 = (float)(uVar49 ^ (uint)(fVar92 * (float)local_8f8._0_4_ +
                                            fVar87 * (float)local_8e8._0_4_ + fVar43 * local_8d8[0])
                            );
            fVar89 = (float)(uVar52 ^ (uint)(fVar96 * (float)local_8f8._4_4_ +
                                            fVar89 * (float)local_8e8._4_4_ + fVar50 * local_8d8[1])
                            );
            fVar50 = (float)(uVar55 ^ (uint)(fVar97 * fStack_8f0 +
                                            fVar90 * fStack_8e0 + fVar53 * local_8d8[2]));
            fVar90 = (float)(uVar58 ^ (uint)(fVar99 * fStack_8ec +
                                            fVar91 * fStack_8dc + fVar56 * local_8d8[3]));
            fVar99 = *(float *)(ray + k * 4 + 0x30);
            fVar87 = *(float *)(ray + k * 4 + 0x80);
            auVar93._0_4_ = fVar87 * fVar129;
            auVar93._4_4_ = fVar87 * fVar134;
            auVar93._8_4_ = fVar87 * auVar132._8_4_;
            auVar93._12_4_ = fVar87 * auVar132._12_4_;
            auVar44._0_4_ =
                 -(uint)((fVar99 * fVar129 < fVar43 && fVar43 <= auVar93._0_4_) && bVar17);
            auVar44._4_4_ =
                 -(uint)((fVar99 * fVar134 < fVar89 && fVar89 <= auVar93._4_4_) && bVar19);
            auVar44._8_4_ =
                 -(uint)((fVar99 * auVar132._8_4_ < fVar50 && fVar50 <= auVar93._8_4_) && bVar18);
            auVar44._12_4_ =
                 -(uint)((fVar99 * auVar132._12_4_ < fVar90 && fVar90 <= auVar93._12_4_) && bVar40);
            uVar22 = movmskps(uVar22,auVar44);
            if (uVar22 != 0) {
              local_8c8._8_8_ = uStack_7e0;
              local_8c8._0_8_ = local_7e8;
              auVar111 = rcpps(auVar93,auVar132);
              fVar99 = auVar111._0_4_;
              fVar87 = auVar111._4_4_;
              fVar53 = auVar111._8_4_;
              fVar91 = auVar111._12_4_;
              fVar56 = (float)DAT_01feca10;
              fVar81 = DAT_01feca10._4_4_;
              fVar92 = DAT_01feca10._8_4_;
              fVar96 = DAT_01feca10._12_4_;
              fVar99 = (fVar56 - fVar129 * fVar99) * fVar99 + fVar99;
              fVar87 = (fVar81 - fVar134 * fVar87) * fVar87 + fVar87;
              fVar53 = (fVar92 - auVar132._8_4_ * fVar53) * fVar53 + fVar53;
              fVar91 = (fVar96 - auVar132._12_4_ * fVar91) * fVar91 + fVar91;
              local_908[0] = fVar43 * fVar99;
              local_908[1] = fVar89 * fVar87;
              local_908[2] = fVar50 * fVar53;
              local_908[3] = fVar90 * fVar91;
              auVar62._0_4_ = fVar61 * fVar99;
              auVar62._4_4_ = fVar71 * fVar87;
              auVar62._8_4_ = fVar76 * fVar53;
              auVar62._12_4_ = fVar60 * fVar91;
              auVar111 = minps(auVar62,_DAT_01feca10);
              auVar88._0_4_ = fVar99 * fVar70;
              auVar88._4_4_ = fVar87 * fVar75;
              auVar88._8_4_ = fVar53 * fVar136;
              auVar88._12_4_ = fVar91 * fVar138;
              auVar132 = minps(auVar88,_DAT_01feca10);
              auVar94._0_4_ = fVar56 - auVar111._0_4_;
              auVar94._4_4_ = fVar81 - auVar111._4_4_;
              auVar94._8_4_ = fVar92 - auVar111._8_4_;
              auVar94._12_4_ = fVar96 - auVar111._12_4_;
              local_928 = blendvps(auVar111,auVar94,local_8c8);
              auVar16._4_4_ = fVar81 - auVar132._4_4_;
              auVar16._0_4_ = fVar56 - auVar132._0_4_;
              auVar16._8_4_ = fVar92 - auVar132._8_4_;
              auVar16._12_4_ = fVar96 - auVar132._12_4_;
              local_918 = blendvps(auVar132,auVar16,local_8c8);
              uVar31 = (ulong)(byte)uVar22;
              fVar71 = local_ad8;
              fVar43 = fStack_ad4;
              fVar134 = fStack_ad0;
              fVar89 = fStack_acc;
              fVar76 = local_ae8;
              fVar50 = fStack_ae4;
              fVar136 = fStack_ae0;
              fVar90 = fStack_adc;
              fVar129 = local_af8;
              fVar53 = fStack_af4;
              fVar138 = fStack_af0;
              fVar91 = fStack_aec;
              iVar21 = local_b18;
              iVar121 = iStack_b14;
              iVar124 = iStack_b10;
              iVar127 = iStack_b0c;
              fVar99 = local_ab8;
              fVar56 = fStack_ab4;
              fVar60 = fStack_ab0;
              fVar70 = fStack_aac;
              fVar61 = local_ac8;
              fVar75 = fStack_ac4;
              fVar81 = fStack_ac0;
              fVar92 = fStack_abc;
              fVar87 = local_b08;
              fVar96 = fStack_b04;
              fVar97 = fStack_b00;
              fVar101 = fStack_afc;
              iVar128 = local_b28;
              iVar133 = iStack_b24;
              iVar135 = iStack_b20;
              iVar137 = iStack_b1c;
              do {
                uVar32 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                local_858 = puVar38[uVar32];
                pGVar11 = (pSVar29->geometries).items[local_858].ptr;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  uVar22 = (uint)CONCAT71((uint7)(uint3)(*(uint *)(ray + k * 4 + 0x90) >> 8),1);
                  uVar31 = uVar31 ^ 1L << (uVar32 & 0x3f);
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar22 = 0;
                }
                else {
                  local_828 = fVar106;
                  fStack_824 = fVar107;
                  fStack_820 = fVar108;
                  fStack_81c = fVar109;
                  local_818 = fVar112;
                  fStack_814 = fVar113;
                  fStack_810 = fVar115;
                  fStack_80c = fVar117;
                  local_808 = fVar102;
                  fStack_804 = fVar103;
                  fStack_800 = fVar104;
                  fStack_7fc = fVar105;
                  local_b2c = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_888 = *(undefined4 *)(local_928 + uVar32 * 4);
                  fVar99 = local_908[uVar32 - 4];
                  *(float *)(ray + k * 4 + 0x80) = local_908[uVar32];
                  args.context = context->user;
                  local_868 = *(undefined4 *)(local_a38 + 0x50 + uVar32 * 4);
                  local_878._4_4_ = fVar99;
                  local_878._0_4_ = fVar99;
                  local_878._8_4_ = fVar99;
                  local_878._12_4_ = fVar99;
                  local_8b8 = *(undefined4 *)(local_8f8 + uVar32 * 4);
                  local_8a8 = local_8d8[uVar32 - 4];
                  local_898 = local_8d8[uVar32];
                  uStack_8b4 = local_8b8;
                  uStack_8b0 = local_8b8;
                  uStack_8ac = local_8b8;
                  fStack_8a4 = local_8a8;
                  fStack_8a0 = local_8a8;
                  fStack_89c = local_8a8;
                  fStack_894 = local_898;
                  fStack_890 = local_898;
                  fStack_88c = local_898;
                  uStack_884 = local_888;
                  uStack_880 = local_888;
                  uStack_87c = local_888;
                  uStack_864 = local_868;
                  uStack_860 = local_868;
                  uStack_85c = local_868;
                  uStack_854 = local_858;
                  uStack_850 = local_858;
                  uStack_84c = local_858;
                  local_848 = (args.context)->instID[0];
                  uStack_844 = local_848;
                  uStack_840 = local_848;
                  uStack_83c = local_848;
                  local_838 = (args.context)->instPrimID[0];
                  uStack_834 = local_838;
                  uStack_830 = local_838;
                  uStack_82c = local_838;
                  local_b48 = *local_a78;
                  args.valid = (int *)local_b48;
                  args.geometryUserPtr = pGVar11->userPtr;
                  args.hit = (RTCHitN *)&local_8b8;
                  args.N = 4;
                  pRVar25 = (RTCRayN *)pGVar11->occlusionFilterN;
                  local_b38 = uVar31;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar25 != (RTCRayN *)0x0) {
                    pRVar25 = (RTCRayN *)(*(code *)pRVar25)(&args);
                  }
                  if (local_b48 == (undefined1  [16])0x0) {
                    auVar63._8_4_ = 0xffffffff;
                    auVar63._0_8_ = 0xffffffffffffffff;
                    auVar63._12_4_ = 0xffffffff;
                    auVar63 = auVar63 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&args);
                    }
                    auVar45._0_4_ = -(uint)(local_b48._0_4_ == 0);
                    auVar45._4_4_ = -(uint)(local_b48._4_4_ == 0);
                    auVar45._8_4_ = -(uint)(local_b48._8_4_ == 0);
                    auVar45._12_4_ = -(uint)(local_b48._12_4_ == 0);
                    auVar63 = auVar45 ^ _DAT_01febe20;
                    auVar111 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),
                                        auVar45);
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar111;
                    pRVar25 = args.ray;
                  }
                  auVar64._0_4_ = auVar63._0_4_ << 0x1f;
                  auVar64._4_4_ = auVar63._4_4_ << 0x1f;
                  auVar64._8_4_ = auVar63._8_4_ << 0x1f;
                  auVar64._12_4_ = auVar63._12_4_ << 0x1f;
                  iVar23 = movmskps((int)pRVar25,auVar64);
                  uVar22 = CONCAT31((int3)((uint)iVar23 >> 8),iVar23 == 0);
                  pSVar29 = local_a30;
                  uVar31 = local_b38;
                  fVar71 = local_ad8;
                  fVar43 = fStack_ad4;
                  fVar134 = fStack_ad0;
                  fVar89 = fStack_acc;
                  fVar76 = local_ae8;
                  fVar50 = fStack_ae4;
                  fVar136 = fStack_ae0;
                  fVar90 = fStack_adc;
                  fVar129 = local_af8;
                  fVar53 = fStack_af4;
                  fVar138 = fStack_af0;
                  fVar91 = fStack_aec;
                  iVar21 = local_b18;
                  iVar121 = iStack_b14;
                  iVar124 = iStack_b10;
                  iVar127 = iStack_b0c;
                  fVar102 = local_808;
                  fVar103 = fStack_804;
                  fVar104 = fStack_800;
                  fVar105 = fStack_7fc;
                  fVar112 = local_818;
                  fVar113 = fStack_814;
                  fVar115 = fStack_810;
                  fVar117 = fStack_80c;
                  fVar106 = local_828;
                  fVar107 = fStack_824;
                  fVar108 = fStack_820;
                  fVar109 = fStack_81c;
                  fVar99 = local_ab8;
                  fVar56 = fStack_ab4;
                  fVar60 = fStack_ab0;
                  fVar70 = fStack_aac;
                  fVar61 = local_ac8;
                  fVar75 = fStack_ac4;
                  fVar81 = fStack_ac0;
                  fVar92 = fStack_abc;
                  fVar87 = local_b08;
                  fVar96 = fStack_b04;
                  fVar97 = fStack_b00;
                  fVar101 = fStack_afc;
                  iVar128 = local_b28;
                  iVar133 = iStack_b24;
                  iVar135 = iStack_b20;
                  iVar137 = iStack_b1c;
                  if (iVar23 == 0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_b2c;
                    uVar31 = local_b38 ^ 1L << (uVar32 & 0x3f);
                    local_b38 = uVar31;
                  }
                }
                if ((char)uVar22 == '\0') goto LAB_00288eb5;
              } while (uVar31 != 0);
            }
          }
          fVar51 = local_aa8 - fVar51;
          fVar72 = fVar102 - fVar72;
          fStack_9f0 = fVar106 - fStack_9f0;
          fStack_9ec = fVar112 - fStack_9ec;
          local_a98._0_4_ = fStack_aa4 - (float)local_a98;
          local_a98._4_4_ = fVar103 - local_a98._4_4_;
          fStack_a90 = fVar107 - fStack_a90;
          fStack_a8c = fVar113 - fStack_a8c;
          fVar54 = fStack_aa0 - fVar54;
          fVar78 = fVar104 - fVar78;
          fVar114 = fVar108 - fVar114;
          fVar116 = fVar115 - fVar116;
          fVar41 = fVar41 - local_aa8;
          fVar57 = fVar57 - fVar102;
          fVar77 = fVar77 - fVar106;
          fVar82 = fVar82 - fVar112;
          fVar48 = fVar48 - fStack_aa4;
          fVar67 = fVar67 - fVar103;
          fVar98 = fVar98 - fVar107;
          fVar100 = fVar100 - fVar113;
          local_a88._0_4_ = (float)local_a88 - fStack_aa0;
          local_a88._4_4_ = local_a88._4_4_ - fVar104;
          fVar89 = fStack_a80 - fVar108;
          fVar97 = fStack_a7c - fVar115;
          local_8f8._0_4_ = fVar48 * fVar54 - (float)local_a88 * (float)local_a98;
          local_8f8._4_4_ = fVar67 * fVar78 - local_a88._4_4_ * local_a98._4_4_;
          fStack_8f0 = fVar98 * fVar114 - fVar89 * fStack_a90;
          fStack_8ec = fVar100 * fVar116 - fVar97 * fStack_a8c;
          local_8e8._0_4_ = (float)local_a88 * fVar51 - fVar41 * fVar54;
          local_8e8._4_4_ = local_a88._4_4_ * fVar72 - fVar57 * fVar78;
          fStack_8e0 = fVar89 * fStack_9f0 - fVar77 * fVar114;
          fStack_8dc = fVar97 * fStack_9ec - fVar82 * fVar116;
          local_8d8[0] = fVar41 * (float)local_a98 - fVar48 * fVar51;
          local_8d8[1] = fVar57 * local_a98._4_4_ - fVar67 * fVar72;
          local_8d8[2] = fVar77 * fStack_a90 - fVar98 * fStack_9f0;
          local_8d8[3] = fVar82 * fStack_a8c - fVar100 * fStack_9ec;
          fVar99 = *(float *)(ray + k * 4);
          fVar61 = *(float *)(ray + k * 4 + 0x10);
          fStack_a9c = *(float *)(ray + k * 4 + 0x20);
          fVar71 = *(float *)(ray + k * 4 + 0x40);
          fVar76 = *(float *)(ray + k * 4 + 0x50);
          fVar129 = *(float *)(ray + k * 4 + 0x60);
          fVar87 = local_aa8 - fVar99;
          fVar102 = fVar102 - fVar99;
          fVar106 = fVar106 - fVar99;
          fVar112 = fVar112 - fVar99;
          fVar138 = fStack_aa4 - fVar61;
          fVar103 = fVar103 - fVar61;
          fStack_a80 = fVar107 - fVar61;
          fStack_a7c = fVar113 - fVar61;
          local_aa8 = fStack_aa0 - fStack_a9c;
          fStack_aa4 = fVar104 - fStack_a9c;
          fStack_aa0 = fVar108 - fStack_a9c;
          fStack_a9c = fVar115 - fStack_a9c;
          fVar50 = fVar138 * fVar129 - local_aa8 * fVar76;
          fVar136 = fVar103 * fVar129 - fStack_aa4 * fVar76;
          fVar90 = fStack_a80 * fVar129 - fStack_aa0 * fVar76;
          fVar53 = fStack_a7c * fVar129 - fStack_a9c * fVar76;
          fVar75 = local_aa8 * fVar71 - fVar87 * fVar129;
          fVar81 = fStack_aa4 * fVar71 - fVar102 * fVar129;
          fVar92 = fStack_aa0 * fVar71 - fVar106 * fVar129;
          fVar96 = fStack_a9c * fVar71 - fVar112 * fVar129;
          fVar99 = fVar87 * fVar76 - fVar138 * fVar71;
          fVar61 = fVar102 * fVar76 - fVar103 * fVar71;
          fVar43 = fVar106 * fVar76 - fStack_a80 * fVar71;
          fVar134 = fVar112 * fVar76 - fStack_a7c * fVar71;
          fVar91 = fVar71 * (float)local_8f8._0_4_ +
                   fVar76 * (float)local_8e8._0_4_ + fVar129 * local_8d8[0];
          fVar56 = fVar71 * (float)local_8f8._4_4_ +
                   fVar76 * (float)local_8e8._4_4_ + fVar129 * local_8d8[1];
          fVar60 = fVar71 * fStack_8f0 + fVar76 * fStack_8e0 + fVar129 * local_8d8[2];
          fVar70 = fVar71 * fStack_8ec + fVar76 * fStack_8dc + fVar129 * local_8d8[3];
          uVar42 = (uint)fVar91 & 0x80000000;
          uVar49 = (uint)fVar56 & 0x80000000;
          uVar52 = (uint)fVar60 & 0x80000000;
          uVar55 = (uint)fVar70 & 0x80000000;
          fVar71 = (float)((uint)(fVar41 * fVar50 + fVar48 * fVar75 + (float)local_a88 * fVar99) ^
                          uVar42);
          fVar76 = (float)((uint)(fVar57 * fVar136 + fVar67 * fVar81 + local_a88._4_4_ * fVar61) ^
                          uVar49);
          fVar129 = (float)((uint)(fVar77 * fVar90 + fVar98 * fVar92 + fVar89 * fVar43) ^ uVar52);
          fVar89 = (float)((uint)(fVar82 * fVar53 + fVar100 * fVar96 + fVar97 * fVar134) ^ uVar55);
          fVar99 = (float)((uint)(fVar50 * fVar51 + fVar75 * (float)local_a98 + fVar99 * fVar54) ^
                          uVar42);
          fVar61 = (float)((uint)(fVar136 * fVar72 + fVar81 * local_a98._4_4_ + fVar61 * fVar78) ^
                          uVar49);
          fVar43 = (float)((uint)(fVar90 * fStack_9f0 + fVar92 * fStack_a90 + fVar43 * fVar114) ^
                          uVar52);
          fVar134 = (float)((uint)(fVar53 * fStack_9ec + fVar96 * fStack_a8c + fVar134 * fVar116) ^
                           uVar55);
          fVar50 = ABS(fVar91);
          fVar136 = ABS(fVar56);
          fVar90 = ABS(fVar60);
          fVar53 = ABS(fVar70);
          bVar18 = (fVar91 != 0.0 && (0.0 <= fVar71 && 0.0 <= fVar99)) && fVar71 + fVar99 <= fVar50;
          auVar110._0_4_ = -(uint)bVar18;
          bVar19 = ((0.0 <= fVar76 && 0.0 <= fVar61) && fVar56 != 0.0) && fVar76 + fVar61 <= fVar136
          ;
          auVar110._4_4_ = -(uint)bVar19;
          bVar17 = ((0.0 <= fVar129 && 0.0 <= fVar43) && fVar60 != 0.0) &&
                   fVar129 + fVar43 <= fVar90;
          auVar110._8_4_ = -(uint)bVar17;
          bVar40 = ((0.0 <= fVar89 && 0.0 <= fVar134) && fVar70 != 0.0) &&
                   fVar89 + fVar134 <= fVar53;
          auVar110._12_4_ = -(uint)bVar40;
          iVar21 = movmskps(uVar22,auVar110);
          if (iVar21 != 0) {
            fVar91 = (float)(uVar42 ^ (uint)(fVar87 * (float)local_8f8._0_4_ +
                                            fVar138 * (float)local_8e8._0_4_ +
                                            local_aa8 * local_8d8[0]));
            fVar56 = (float)(uVar49 ^ (uint)(fVar102 * (float)local_8f8._4_4_ +
                                            fVar103 * (float)local_8e8._4_4_ +
                                            fStack_aa4 * local_8d8[1]));
            fVar60 = (float)(uVar52 ^ (uint)(fVar106 * fStack_8f0 +
                                            fStack_a80 * fStack_8e0 + fStack_aa0 * local_8d8[2]));
            fVar70 = (float)(uVar55 ^ (uint)(fVar112 * fStack_8ec +
                                            fStack_a7c * fStack_8dc + fStack_a9c * local_8d8[3]));
            fVar87 = *(float *)(ray + k * 4 + 0x30);
            fVar138 = *(float *)(ray + k * 4 + 0x80);
            auVar46._0_4_ =
                 -(uint)((fVar87 * fVar50 < fVar91 && fVar91 <= fVar138 * fVar50) && bVar18);
            auVar46._4_4_ =
                 -(uint)((fVar87 * fVar136 < fVar56 && fVar56 <= fVar138 * fVar136) && bVar19);
            auVar46._8_4_ =
                 -(uint)((fVar87 * fVar90 < fVar60 && fVar60 <= fVar138 * fVar90) && bVar17);
            auVar46._12_4_ =
                 -(uint)((fVar87 * fVar53 < fVar70 && fVar70 <= fVar138 * fVar53) && bVar40);
            iVar21 = movmskps(iVar21,auVar46);
            if (iVar21 != 0) {
              local_8c8 = local_7f8;
              local_a88 = context->scene;
              auVar14._4_4_ = fVar136;
              auVar14._0_4_ = fVar50;
              auVar14._8_4_ = fVar90;
              auVar14._12_4_ = fVar53;
              auVar111 = rcpps(auVar110,auVar14);
              fVar87 = auVar111._0_4_;
              fVar138 = auVar111._4_4_;
              fVar75 = auVar111._8_4_;
              fVar81 = auVar111._12_4_;
              fVar92 = (float)DAT_01feca10;
              fVar96 = DAT_01feca10._4_4_;
              fVar97 = DAT_01feca10._8_4_;
              fVar101 = DAT_01feca10._12_4_;
              fVar87 = (fVar92 - fVar50 * fVar87) * fVar87 + fVar87;
              fVar138 = (fVar96 - fVar136 * fVar138) * fVar138 + fVar138;
              fVar75 = (fVar97 - fVar90 * fVar75) * fVar75 + fVar75;
              fVar81 = (fVar101 - fVar53 * fVar81) * fVar81 + fVar81;
              local_908[0] = fVar91 * fVar87;
              local_908[1] = fVar56 * fVar138;
              local_908[2] = fVar60 * fVar75;
              local_908[3] = fVar70 * fVar81;
              auVar131._0_4_ = fVar71 * fVar87;
              auVar131._4_4_ = fVar76 * fVar138;
              auVar131._8_4_ = fVar129 * fVar75;
              auVar131._12_4_ = fVar89 * fVar81;
              auVar132 = minps(auVar131,_DAT_01feca10);
              auVar95._0_4_ = fVar87 * fVar99;
              auVar95._4_4_ = fVar138 * fVar61;
              auVar95._8_4_ = fVar75 * fVar43;
              auVar95._12_4_ = fVar81 * fVar134;
              auVar111 = minps(auVar95,_DAT_01feca10);
              auVar13._4_4_ = fVar96 - auVar132._4_4_;
              auVar13._0_4_ = fVar92 - auVar132._0_4_;
              auVar13._8_4_ = fVar97 - auVar132._8_4_;
              auVar13._12_4_ = fVar101 - auVar132._12_4_;
              local_928 = blendvps(auVar132,auVar13,local_7f8);
              auVar15._4_4_ = fVar96 - auVar111._4_4_;
              auVar15._0_4_ = fVar92 - auVar111._0_4_;
              auVar15._8_4_ = fVar97 - auVar111._8_4_;
              auVar15._12_4_ = fVar101 - auVar111._12_4_;
              local_918 = blendvps(auVar111,auVar15,local_7f8);
              uVar31 = (ulong)(byte)iVar21;
              fVar71 = local_ad8;
              fVar43 = fStack_ad4;
              fVar134 = fStack_ad0;
              fVar89 = fStack_acc;
              fVar76 = local_ae8;
              fVar50 = fStack_ae4;
              fVar136 = fStack_ae0;
              fVar90 = fStack_adc;
              fVar129 = local_af8;
              fVar53 = fStack_af4;
              fVar138 = fStack_af0;
              fVar91 = fStack_aec;
              iVar21 = local_b18;
              iVar121 = iStack_b14;
              iVar124 = iStack_b10;
              iVar127 = iStack_b0c;
              fVar99 = local_ab8;
              fVar56 = fStack_ab4;
              fVar60 = fStack_ab0;
              fVar70 = fStack_aac;
              fVar61 = local_ac8;
              fVar75 = fStack_ac4;
              fVar81 = fStack_ac0;
              fVar92 = fStack_abc;
              fVar87 = local_b08;
              fVar96 = fStack_b04;
              fVar97 = fStack_b00;
              fVar101 = fStack_afc;
              iVar128 = local_b28;
              iVar133 = iStack_b24;
              iVar135 = iStack_b20;
              iVar137 = iStack_b1c;
              do {
                uVar32 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                local_858 = puVar38[uVar32];
                local_a98 = (local_a88->geometries).items[local_858].ptr;
                if ((local_a98->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  uVar31 = uVar31 ^ 1L << (uVar32 & 0x3f);
                  bVar40 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (local_a98->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar40 = false;
                }
                else {
                  uVar20 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_888 = *(undefined4 *)(local_928 + uVar32 * 4);
                  fVar99 = local_908[uVar32 - 4];
                  *(float *)(ray + k * 4 + 0x80) = local_908[uVar32];
                  args.context = context->user;
                  local_868 = *(undefined4 *)(local_a38 + 0x50 + uVar32 * 4);
                  local_878._4_4_ = fVar99;
                  local_878._0_4_ = fVar99;
                  local_878._8_4_ = fVar99;
                  local_878._12_4_ = fVar99;
                  local_8b8 = *(undefined4 *)(local_8f8 + uVar32 * 4);
                  local_8a8 = local_8d8[uVar32 - 4];
                  local_898 = local_8d8[uVar32];
                  uStack_8b4 = local_8b8;
                  uStack_8b0 = local_8b8;
                  uStack_8ac = local_8b8;
                  fStack_8a4 = local_8a8;
                  fStack_8a0 = local_8a8;
                  fStack_89c = local_8a8;
                  fStack_894 = local_898;
                  fStack_890 = local_898;
                  fStack_88c = local_898;
                  uStack_884 = local_888;
                  uStack_880 = local_888;
                  uStack_87c = local_888;
                  uStack_864 = local_868;
                  uStack_860 = local_868;
                  uStack_85c = local_868;
                  uStack_854 = local_858;
                  uStack_850 = local_858;
                  uStack_84c = local_858;
                  local_848 = (args.context)->instID[0];
                  uStack_844 = local_848;
                  uStack_840 = local_848;
                  uStack_83c = local_848;
                  local_838 = (args.context)->instPrimID[0];
                  uStack_834 = local_838;
                  uStack_830 = local_838;
                  uStack_82c = local_838;
                  local_b48 = *local_a78;
                  args.valid = (int *)local_b48;
                  args.geometryUserPtr = local_a98->userPtr;
                  args.hit = (RTCHitN *)&local_8b8;
                  args.N = 4;
                  pRVar25 = (RTCRayN *)local_a98->occlusionFilterN;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar25 != (RTCRayN *)0x0) {
                    pRVar25 = (RTCRayN *)(*(code *)pRVar25)(&args);
                  }
                  if (local_b48 == (undefined1  [16])0x0) {
                    auVar65._8_4_ = 0xffffffff;
                    auVar65._0_8_ = 0xffffffffffffffff;
                    auVar65._12_4_ = 0xffffffff;
                    auVar65 = auVar65 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((local_a98->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&args);
                    }
                    auVar47._0_4_ = -(uint)(local_b48._0_4_ == 0);
                    auVar47._4_4_ = -(uint)(local_b48._4_4_ == 0);
                    auVar47._8_4_ = -(uint)(local_b48._8_4_ == 0);
                    auVar47._12_4_ = -(uint)(local_b48._12_4_ == 0);
                    auVar65 = auVar47 ^ _DAT_01febe20;
                    auVar111 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),
                                        auVar47);
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar111;
                    pRVar25 = args.ray;
                  }
                  auVar66._0_4_ = auVar65._0_4_ << 0x1f;
                  auVar66._4_4_ = auVar65._4_4_ << 0x1f;
                  auVar66._8_4_ = auVar65._8_4_ << 0x1f;
                  auVar66._12_4_ = auVar65._12_4_ << 0x1f;
                  iVar21 = movmskps((int)pRVar25,auVar66);
                  bVar40 = iVar21 == 0;
                  fVar71 = local_ad8;
                  fVar43 = fStack_ad4;
                  fVar134 = fStack_ad0;
                  fVar89 = fStack_acc;
                  fVar76 = local_ae8;
                  fVar50 = fStack_ae4;
                  fVar136 = fStack_ae0;
                  fVar90 = fStack_adc;
                  fVar129 = local_af8;
                  fVar53 = fStack_af4;
                  fVar138 = fStack_af0;
                  fVar91 = fStack_aec;
                  iVar21 = local_b18;
                  iVar121 = iStack_b14;
                  iVar124 = iStack_b10;
                  iVar127 = iStack_b0c;
                  fVar99 = local_ab8;
                  fVar56 = fStack_ab4;
                  fVar60 = fStack_ab0;
                  fVar70 = fStack_aac;
                  fVar61 = local_ac8;
                  fVar75 = fStack_ac4;
                  fVar81 = fStack_ac0;
                  fVar92 = fStack_abc;
                  fVar87 = local_b08;
                  fVar96 = fStack_b04;
                  fVar97 = fStack_b00;
                  fVar101 = fStack_afc;
                  iVar128 = local_b28;
                  iVar133 = iStack_b24;
                  iVar135 = iStack_b20;
                  iVar137 = iStack_b1c;
                  if (bVar40) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar20;
                    uVar31 = uVar31 ^ 1L << (uVar32 & 0x3f);
                  }
                }
                if (!bVar40) goto LAB_00288eb5;
              } while (uVar31 != 0);
            }
          }
          uVar30 = uVar30 + 1;
          bVar39 = uVar30 < uVar27;
        } while (uVar30 != uVar27);
        uVar22 = 0;
        uVar30 = local_a48;
        uVar31 = local_a50;
        uVar32 = local_a58;
        uVar33 = local_a60;
        uVar34 = local_a68;
        uVar37 = local_a70;
        fVar71 = local_ad8;
        fVar43 = fStack_ad4;
        fVar134 = fStack_ad0;
        fVar89 = fStack_acc;
        fVar76 = local_ae8;
        fVar50 = fStack_ae4;
        fVar136 = fStack_ae0;
        fVar90 = fStack_adc;
        fVar129 = local_af8;
        fVar53 = fStack_af4;
        fVar138 = fStack_af0;
        fVar91 = fStack_aec;
        iVar21 = local_b18;
        iVar121 = iStack_b14;
        iVar124 = iStack_b10;
        iVar127 = iStack_b0c;
        fVar99 = local_ab8;
        fVar56 = fStack_ab4;
        fVar60 = fStack_ab0;
        fVar70 = fStack_aac;
        fVar61 = local_ac8;
        fVar75 = fStack_ac4;
        fVar81 = fStack_ac0;
        fVar92 = fStack_abc;
        fVar87 = local_b08;
        fVar96 = fStack_b04;
        fVar97 = fStack_b00;
        fVar101 = fStack_afc;
        iVar128 = local_b28;
        iVar133 = iStack_b24;
        iVar135 = iStack_b20;
        iVar137 = iStack_b1c;
      }
    }
    goto LAB_00288eab;
  }
  goto LAB_00288f12;
LAB_00288eb5:
  uVar22 = 0;
  uVar30 = local_a48;
  uVar31 = local_a50;
  uVar32 = local_a58;
  uVar33 = local_a60;
  uVar34 = local_a68;
  uVar37 = local_a70;
  if (bVar39) {
    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
    uVar22 = 1;
  }
LAB_00288eab:
  if ((uVar22 & 3) != 0) {
LAB_00288f12:
    return pNVar28 != stack;
  }
  goto LAB_00287ea7;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }